

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O0

size_t interpolative_internal::decode(uint32_t *f,uint32_t *out_buf,size_t n,size_t u)

{
  size_t sVar1;
  long in_RCX;
  uint32_t *in_RDI;
  size_t high;
  size_t low;
  bit_stream is;
  uint32_t *in_stack_ffffffffffffff90;
  uint32_t *in_stack_ffffffffffffff98;
  bit_stream *in_stack_ffffffffffffffa0;
  
  bit_stream::bit_stream((bit_stream *)&stack0xffffffffffffff90,in_RDI,false);
  decode_interpolative
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,1
             ,in_RCX + 1);
  sVar1 = bit_stream::u32_read((bit_stream *)&stack0xffffffffffffff90);
  bit_stream::~bit_stream((bit_stream *)0x1992fa);
  return sVar1;
}

Assistant:

static inline size_t decode(
        const uint32_t* f, uint32_t* out_buf, size_t n, size_t u)
    {
        bit_stream is((uint32_t*)f, false);
        size_t low = 1;
        size_t high = u + 1;
        decode_interpolative(is, out_buf, n, low, high);
        return is.u32_read();
    }